

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv2d.cpp
# Opt level: O2

void load_model(test_model *model,bool use_gpu)

{
  void *pvVar1;
  char cVar2;
  int i;
  int iVar3;
  long lVar4;
  long lVar5;
  ggml_backend_t pgVar6;
  ggml_backend_buffer_t pgVar7;
  ggml_context *pgVar8;
  ggml_tensor *pgVar9;
  size_t sVar10;
  undefined8 uVar11;
  int i_1;
  ulong uVar12;
  float fVar13;
  vector<float,_std::allocator<float>_> bdata;
  vector<unsigned_short,_std::allocator<unsigned_short>_> hadata;
  undefined4 uStack_68;
  undefined7 uStack_5f;
  ggml_tallocr alloc;
  vector<float,_std::allocator<float>_> adata;
  
  std::vector<float,_std::allocator<float>_>::vector(&adata,900,(allocator_type *)&alloc);
  for (lVar4 = 0; lVar4 != 900; lVar4 = lVar4 + 1) {
    adata.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [lVar4] = 2.5;
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&hadata,900,(allocator_type *)&alloc);
  ggml_fp32_to_fp16_row
            (adata.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
             ._M_start,
             hadata.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start,900);
  std::vector<float,_std::allocator<float>_>::vector(&bdata,0x1e0,(allocator_type *)&alloc);
  for (lVar4 = 0; lVar4 != 0x1e0; lVar4 = lVar4 + 1) {
    bdata.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [lVar4] = 1.5;
  }
  lVar4 = ggml_type_size(1);
  lVar5 = ggml_type_size(0);
  uVar12 = lVar4 * 900 + lVar5 * 0x1e0 + 0x400;
  printf("%s: ggml tensor size    = %d bytes\n","load_model",0x150);
  if ((long)uVar12 < 0) {
    fVar13 = (float)(uVar12 >> 1) + (float)(uVar12 >> 1);
  }
  else {
    fVar13 = (float)(long)uVar12;
  }
  printf("%s: backend buffer size = %0.2f MB\n",
         SUB84((double)(fVar13 * 0.0009765625 * 0.0009765625),0),"load_model");
  iVar3 = ggml_tensor_overhead();
  ggml_log_set(ggml_log_callback_default,0);
  pgVar6 = model->backend;
  if (pgVar6 == (ggml_backend_t)0x0) {
    pgVar6 = (ggml_backend_t)ggml_backend_cpu_init();
    model->backend = pgVar6;
  }
  pgVar7 = (ggml_backend_buffer_t)ggml_backend_alloc_buffer(pgVar6,uVar12);
  iVar3 = iVar3 * 2;
  model->buffer = pgVar7;
  uVar11 = CONCAT71(uStack_5f,1);
  uStack_68 = 0;
  pgVar8 = (ggml_context *)ggml_init();
  model->ctx = pgVar8;
  pgVar9 = (ggml_tensor *)ggml_new_tensor_4d(pgVar8,1,3,3,10,10,iVar3,uStack_68,uVar11);
  model->a = pgVar9;
  pgVar9 = (ggml_tensor *)ggml_new_tensor_4d(model->ctx,0,8,6,10,1);
  model->b = pgVar9;
  ggml_tallocr_new(&alloc,model->buffer);
  ggml_tallocr_alloc(&alloc,model->a);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar9 = model->a;
  if (cVar2 == '\0') {
    uVar11 = ggml_nbytes(pgVar9);
    ggml_backend_tensor_set
              (pgVar9,hadata.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start,0,uVar11);
  }
  else {
    pvVar1 = pgVar9->data;
    sVar10 = ggml_nbytes(pgVar9);
    memcpy(pvVar1,hadata.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                  .super__Vector_impl_data._M_start,sVar10);
  }
  ggml_tallocr_alloc(&alloc,model->b);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar9 = model->b;
  if (cVar2 == '\0') {
    uVar11 = ggml_nbytes(pgVar9);
    ggml_backend_tensor_set
              (pgVar9,bdata.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,0,uVar11);
  }
  else {
    pvVar1 = pgVar9->data;
    sVar10 = ggml_nbytes(pgVar9);
    memcpy(pvVar1,bdata.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start,sVar10);
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&bdata.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&hadata.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&adata.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void load_model(test_model & model, bool use_gpu = false) {
    // create data
    int KW = 3, KH = 3, IC = 10, OC = 10;
    int IW = 8, IH = 6, N = 1;

    // Initialize adata
    std::vector<float> adata(KW * KH * IC * OC);
    for (int i = 0; i < KW * KH * IC * OC; i++) {
        adata[i] = 2.5f;
    }

    // Convert adata to fp16 format
    std::vector<ggml_fp16_t> hadata(KW * KH * IC * OC);
    ggml_fp32_to_fp16_row(adata.data(), hadata.data(), KW * KH * IC * OC);

    // Initialize bdata
    std::vector<float> bdata(IW * IH * IC * N);
    for (int i = 0; i < IW * IH * IC * N; i++) {
        bdata[i] = 1.5f;
    }

    size_t buffer_size = 0;
    {
        buffer_size += KW * KH * IC * OC * ggml_type_size(GGML_TYPE_F16); // tensor a
        buffer_size += IW * IH * IC * N  * ggml_type_size(GGML_TYPE_F32); // tensor b
        buffer_size += 1024; // overhead
    }

    printf("%s: ggml tensor size    = %d bytes\n", __func__, (int) sizeof(ggml_tensor));
    printf("%s: backend buffer size = %0.2f MB\n", __func__, (buffer_size/ 1024.f/ 1024.f));

    int num_tensors = 2;
    struct ggml_init_params params {
            /*.mem_size   =*/ ggml_tensor_overhead() * num_tensors,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
    };

    ggml_log_set(ggml_log_callback_default, nullptr);

    // initialize the backend
#ifdef GGML_USE_CUDA
    if (use_gpu) {
        fprintf(stderr, "%s: using CUDA backend\n", __func__);
        model.backend = ggml_backend_cuda_init(0);
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
        }
    }
#endif

#ifdef GGML_USE_METAL
    if (use_gpu) {
        fprintf(stderr, "%s: using Metal backend\n", __func__);
        model.backend = ggml_backend_metal_init();
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
        }
    }
#endif

    if(!model.backend) {
        // fallback to CPU backend
        model.backend = ggml_backend_cpu_init();
    }

    model.buffer = ggml_backend_alloc_buffer(model.backend, buffer_size);

    // create context
    model.ctx = ggml_init(params);

    // create tensors
    model.a = ggml_new_tensor_4d(model.ctx, GGML_TYPE_F16,  KW, KH, IC, OC);
    model.b = ggml_new_tensor_4d(model.ctx, GGML_TYPE_F32, IW, IH, IC, N);

    // create a allocator
    struct ggml_tallocr alloc = ggml_tallocr_new(model.buffer);

    // alloc memory
    ggml_tallocr_alloc(&alloc, model.a);

    // load data to buffer
    if(ggml_backend_is_cpu(model.backend)) {
        memcpy(model.a->data, hadata.data(), ggml_nbytes(model.a));
    } else {
        ggml_backend_tensor_set(model.a, hadata.data(), 0, ggml_nbytes(model.a));
    }

    // alloc memory
    ggml_tallocr_alloc(&alloc, model.b);

    if(ggml_backend_is_cpu(model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
    ) {
        memcpy(model.b->data, bdata.data(), ggml_nbytes(model.b));
    } else {
        ggml_backend_tensor_set(model.b, bdata.data(), 0, ggml_nbytes(model.b));
    }
}